

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

shared_ptr<nuraft::buffer> * __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this)

{
  element_type *peVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->lock_);
  if (this->has_result_ == false) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  peVar1 = (this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return &this->empty_result_ + (peVar1 == (element_type *)0x0);
}

Assistant:

T& get() {
        std::unique_lock<std::mutex> lock(lock_);
        if (has_result_) {
            if (err_ == nullptr) {
                return result_;
            }
            // Return empty result rather than throw exception.
            // Caller should handle it properly.
            return empty_result_;
        }

        cv_.wait(lock);
        if (err_ == nullptr) {
            return result_;
        }

        return empty_result_;
    }